

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O3

bool __thiscall
higan::MultiplexEpoll::UpdateChannelEvent
          (MultiplexEpoll *this,Channel *channel,int event,int option)

{
  int __fd;
  int iVar1;
  LogLevel LVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  Logger local_350;
  Fmt local_134;
  uint32_t local_34;
  Channel *local_30;
  
  if (channel == (Channel *)0x0) {
    bVar5 = false;
  }
  else {
    iVar1 = this->epollfd_;
    local_34 = event;
    local_30 = channel;
    __fd = Channel::GetFd(channel);
    iVar1 = epoll_ctl(iVar1,option,__fd,(epoll_event *)&local_34);
    if (iVar1 == -1) {
      LVar2 = Logger::GetLogLevel();
      if ((int)LVar2 < 4) {
        Logger::Logger(&local_350,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                       ,99,"UpdateChannelEvent");
        if (option == 1) {
          pcVar4 = "ADD";
        }
        else if (option == 2) {
          pcVar4 = "DEL";
        }
        else {
          pcVar4 = "UNKNOWN";
          if (option == 3) {
            pcVar4 = "MOD";
          }
        }
        uVar3 = Channel::GetFd(channel);
        Fmt::Fmt(&local_134,"EPOLL_CTL_%s error, fd: %d",pcVar4,(ulong)uVar3);
        Logger::operator<<(&local_350,&local_134);
        Logger::~Logger(&local_350);
      }
    }
    bVar5 = iVar1 != 0;
  }
  return bVar5;
}

Assistant:

bool MultiplexEpoll::UpdateChannelEvent(Channel* channel, int event, int option) const
{
	if (channel == nullptr)
	{
		return false;
	}
	struct epoll_event ev{};
	ev.events = event;

	ev.data.ptr = static_cast<void*>(channel);
	ev.events = event;

	int result = epoll_ctl(epollfd_, option, channel->GetFd(), &ev);

	if (result == -1)
	{
		LOG_ERROR << higan::Fmt("EPOLL_CTL_%s error, fd: %d",
					option == EPOLL_CTL_ADD ? "ADD" :
					option == EPOLL_CTL_DEL ? "DEL" :
					option == EPOLL_CTL_MOD ? "MOD" : "UNKNOWN",
					channel->GetFd());
	}

	return result;
}